

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool lookahead_0(ParserContext *context)

{
  _Bool _Var1;
  TokenQueue *token_queue;
  Token *token_00;
  _Bool local_21;
  _Bool match;
  TokenQueue *queue;
  Token *token;
  ParserContext *context_local;
  
  token_queue = TokenQueue_new();
  local_21 = false;
  do {
    token_00 = read_token(context);
    TokenQueue_add(token_queue,token_00);
    _Var1 = match_ScenarioLine(context,token_00);
    if (_Var1) {
      local_21 = true;
      break;
    }
    _Var1 = match_Empty(context,token_00);
  } while (((_Var1) || (_Var1 = match_Comment(context,token_00), _Var1)) ||
          (_Var1 = match_TagLine(context,token_00), _Var1));
  TokenQueue_extend(context->token_queue,token_queue);
  return local_21;
}

Assistant:

static bool lookahead_0(ParserContext* context) {
    Token* token = 0;
    TokenQueue* queue = TokenQueue_new();
    bool match = false;
    while (true) {
        token = read_token(context);
        TokenQueue_add(queue, token);

        if (match_ScenarioLine(context, token) || false) {
            match = true;
            break;
        }

        if (!(match_Empty(context, token) || match_Comment(context, token) || match_TagLine(context, token) || false)) {
            break;
        } 
    }

    TokenQueue_extend(context->token_queue, queue);

    return match;
}